

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::read_modify_write
               (bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp *pMVar1;
  MicroOp local_1a [10];
  
  local_1a[0] = OperationSetMemoryLock;
  if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
  (*target->_M_invoker)((_Any_data *)target,local_1a);
  if (is8bit) {
    local_1a[6] = 6;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    (*target->_M_invoker)((_Any_data *)target,local_1a + 6);
    local_1a[7] = 0x10;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    (*target->_M_invoker)((_Any_data *)target,local_1a + 7);
    local_1a[8] = 0x2e;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    pMVar1 = local_1a + 8;
  }
  else {
    local_1a[1] = 7;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    (*target->_M_invoker)((_Any_data *)target,local_1a + 1);
    local_1a[2] = 6;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    (*target->_M_invoker)((_Any_data *)target,local_1a + 2);
    local_1a[3] = 0x10;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    (*target->_M_invoker)((_Any_data *)target,local_1a + 3);
    local_1a[4] = 0x2e;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    (*target->_M_invoker)((_Any_data *)target,local_1a + 4);
    local_1a[5] = 0x12;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e5005;
    pMVar1 = local_1a + 5;
  }
  (*target->_M_invoker)((_Any_data *)target,pMVar1);
  local_1a[9] = 0xf;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_1a + 9);
    return;
  }
LAB_003e5005:
  std::__throw_bad_function_call();
}

Assistant:

static void read_modify_write(bool is8bit, const std::function<void(MicroOp)> &target) {
		target(OperationSetMemoryLock);					// Set the memory lock output until the end of this instruction.

		if(!is8bit)	target(CycleFetchIncrementData);	// Data low.
		target(CycleFetchData);							// Data [high].

		target(CycleStoreOrFetchDataThrowaway);			// Native mode: reread final byte of data.
														// Emulated mode: rewrite final byte of data.

		target(OperationPerform);						// Perform operation within the data buffer.

		if(!is8bit)	target(CycleStoreDecrementData);	// Data high.
		target(CycleStoreData);							// Data [low].
	}